

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O2

optional<unsigned_char> __thiscall
nesvis::MemoryWidget::read_mem
          (MemoryWidget *this,function<unsigned_char_(unsigned_short)> *memory_read_func,
          uint16_t address)

{
  byte bVar1;
  
  bVar1 = std::function<unsigned_char_(unsigned_short)>::operator()(memory_read_func,address);
  return (_Optional_base<unsigned_char,_true,_true>)
         (_Optional_base<unsigned_char,_true,_true>)(bVar1 | 0x100);
}

Assistant:

std::optional<uint8_t> read_mem(
            const std::function<uint8_t(uint16_t)> &memory_read_func,
            const uint16_t address) {
        try {
            return memory_read_func(address);
        } catch (n_e_s::core::InvalidAddress &) {
            return std::nullopt;
        }
    }